

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

Statement *
slang::ast::ImmediateAssertionStatement::fromSyntax
          (Compilation *compilation,ImmediateAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ParenthesizedExpressionSyntax *pPVar1;
  ExpressionSyntax *pEVar2;
  SyntaxNode *this;
  DeferredAssertionSyntax *pDVar3;
  Statement *stmt;
  Compilation *this_00;
  bool bVar4;
  bool bVar5;
  AssertionKind AVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ActionBlockSyntax *pAVar8;
  StatementSyntax *pSVar9;
  Statement *stmt_00;
  SourceLocation SVar10;
  char *func;
  SourceRange sourceRange;
  bool isFinal;
  bool isDeferred;
  Statement *local_70;
  Statement *ifFalse;
  Statement *ifTrue;
  AssertionKind assertKind;
  Expression *local_50;
  Compilation *local_48;
  SourceRange local_40;
  undefined4 extraout_var_01;
  
  AVar6 = SemanticFacts::getAssertKind((syntax->super_StatementSyntax).super_SyntaxNode.kind);
  pPVar1 = (syntax->expr).ptr;
  assertKind = AVar6;
  if (pPVar1 == (ParenthesizedExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ParenthesizedExpressionSyntax *>::get() const [T = slang::syntax::ParenthesizedExpressionSyntax *]"
    ;
    goto LAB_0028f71c;
  }
  pEVar2 = (pPVar1->expression).ptr;
  if (pEVar2 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
    goto LAB_0028f71c;
  }
  iVar7 = Expression::bind((int)pEVar2,(sockaddr *)context,0);
  local_50 = (Expression *)CONCAT44(extraout_var,iVar7);
  bVar4 = Expression::bad(local_50);
  bVar5 = true;
  if (!bVar4) {
    bVar5 = ASTContext::requireBooleanConvertible(context,local_50);
    bVar5 = !bVar5;
  }
  ifTrue = (Statement *)0x0;
  ifFalse = (Statement *)0x0;
  pAVar8 = (syntax->action).ptr;
  if (pAVar8 != (ActionBlockSyntax *)0x0) {
    if (pAVar8->statement != (StatementSyntax *)0x0) {
      iVar7 = Statement::bind((int)pAVar8->statement,(sockaddr *)context,(socklen_t)stmtCtx);
      local_70 = (Statement *)CONCAT44(extraout_var_00,iVar7);
      pAVar8 = (syntax->action).ptr;
      ifTrue = local_70;
      if (pAVar8 == (ActionBlockSyntax *)0x0) goto LAB_0028f6c2;
    }
    local_70 = ifTrue;
    local_48 = compilation;
    if (pAVar8->elseClause == (ElseClauseSyntax *)0x0) {
      stmt_00 = (Statement *)0x0;
    }
    else {
      this = (pAVar8->elseClause->clause).ptr;
      if (this == (SyntaxNode *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::SyntaxNode *>::get() const [T = slang::syntax::SyntaxNode *]"
        ;
        goto LAB_0028f71c;
      }
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
      iVar7 = Statement::bind((int)pSVar9,(sockaddr *)context,(socklen_t)stmtCtx);
      stmt_00 = (Statement *)CONCAT44(extraout_var_01,iVar7);
      ifFalse = stmt_00;
    }
    stmt = local_70;
    pDVar3 = syntax->delay;
    isFinal = false;
    isDeferred = pDVar3 != (DeferredAssertionSyntax *)0x0;
    if (isDeferred) {
      isFinal = (pDVar3->finalKeyword).info != (Info *)0x0;
    }
    if (((AVar6 & ~Assume) != CoverProperty) || (stmt_00 == (Statement *)0x0)) {
LAB_0028f613:
      this_00 = local_48;
      if (pDVar3 != (DeferredAssertionSyntax *)0x0) {
        if (stmt != (Statement *)0x0) {
          checkDeferredAssertAction(stmt,context);
        }
        if (stmt_00 != (Statement *)0x0) {
          checkDeferredAssertAction(stmt_00,context);
        }
      }
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      SVar10 = (SourceLocation)
               BumpAllocator::
               emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
                         (&this_00->super_BumpAllocator,&assertKind,local_50,&ifTrue,&ifFalse,
                          &isDeferred,&isFinal,&local_40);
      if (((bVar5) || ((ifTrue != (Statement *)0x0 && (ifTrue->kind == Invalid)))) ||
         ((ifFalse != (Statement *)0x0 && (ifFalse->kind == Invalid)))) {
        local_40.startLoc = SVar10;
        SVar10 = (SourceLocation)
                 BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                           (&this_00->super_BumpAllocator,(Statement **)&local_40);
      }
      return (Statement *)SVar10;
    }
    pAVar8 = (syntax->action).ptr;
    if (pAVar8 != (ActionBlockSyntax *)0x0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&pAVar8->elseClause->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0xc0008,sourceRange);
      bVar5 = true;
      goto LAB_0028f613;
    }
  }
LAB_0028f6c2:
  func = 
  "T slang::not_null<slang::syntax::ActionBlockSyntax *>::get() const [T = slang::syntax::ActionBlockSyntax *]"
  ;
LAB_0028f71c:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& ImmediateAssertionStatement::fromSyntax(Compilation& compilation,
                                                   const ImmediateAssertionStatementSyntax& syntax,
                                                   const ASTContext& context,
                                                   StatementContext& stmtCtx) {
    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);
    auto& cond = Expression::bind(*syntax.expr->expression, context);
    bool bad = cond.bad();

    if (!bad && !context.requireBooleanConvertible(cond))
        bad = true;

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    bool isDeferred = syntax.delay != nullptr;
    bool isFinal = false;
    if (isDeferred)
        isFinal = syntax.delay->finalKeyword.valid();

    bool isCover = assertKind == AssertionKind::CoverProperty ||
                   assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        context.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }

    if (isDeferred) {
        if (ifTrue)
            checkDeferredAssertAction(*ifTrue, context);
        if (ifFalse)
            checkDeferredAssertAction(*ifFalse, context);
    }

    auto result = compilation.emplace<ImmediateAssertionStatement>(assertKind, cond, ifTrue,
                                                                   ifFalse, isDeferred, isFinal,
                                                                   syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    return *result;
}